

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  tuple<cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_> tVar1;
  undefined8 *puVar2;
  cmGeneratorTarget *pcVar3;
  size_t __n;
  cmake *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmValue cVar8;
  string *psVar9;
  string *psVar10;
  char *extraout_RDX;
  undefined8 *puVar11;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string e;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _Rb_tree_node_base local_98;
  cmGlobalGenerator *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"C","");
  bVar4 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_f8);
  if (bVar4) {
    bVar4 = false;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CXX","");
    bVar4 = cmState::GetLanguageEnabled
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_50);
    bVar4 = !bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (!bVar4) {
    local_98._M_right =
         (_Base_ptr)
         (this->LocalGenerators).
         super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_left =
         (_Base_ptr)
         (this->LocalGenerators).
         super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_98._M_right != local_98._M_left) {
      bVar4 = false;
      local_78 = this;
      do {
        tVar1.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
        super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
             (((pointer)local_98._M_right)->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>;
        puVar2 = *(undefined8 **)
                  ((long)tVar1.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 0x150);
        for (puVar11 = *(undefined8 **)
                        ((long)tVar1.
                               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                               .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl +
                        0x148); puVar11 != puVar2; puVar11 = puVar11 + 1) {
          bVar5 = cmGeneratorTarget::CanCompileSources((cmGeneratorTarget *)*puVar11);
          bVar6 = true;
          if (bVar5) {
            pcVar3 = (cmGeneratorTarget *)*puVar11;
            local_a8._0_8_ = local_a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_b8 + 0x10),"ghs_integrity_app","");
            cVar8 = cmGeneratorTarget::GetProperty(pcVar3,(string *)(local_b8 + 0x10));
            if (cVar8.Value == (string *)0x0) {
              bVar6 = false;
            }
            else {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
              bVar6 = cmValue::IsOn((cmValue *)(cVar8.Value)->_M_string_length,value);
            }
          }
          if ((bVar5) && ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)(local_a8 + 0x10))) {
            operator_delete((void *)local_a8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_98._0_8_ + 1));
          }
          if (bVar6 == false) {
            pcVar3 = (cmGeneratorTarget *)*puVar11;
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"PRECOMPILE_HEADERS_REUSE_FROM","");
            psVar9 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)local_f8);
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            pcVar3 = (cmGeneratorTarget *)*puVar11;
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"COMPILE_PDB_NAME","");
            psVar10 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)local_f8);
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            __n = psVar9->_M_string_length;
            if ((__n != 0) &&
               ((__n != psVar10->_M_string_length ||
                (iVar7 = bcmp((psVar9->_M_dataplus)._M_p,(psVar10->_M_dataplus)._M_p,__n),
                iVar7 != 0)))) {
              psVar10 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)*puVar11);
              local_f8._24_8_ = (psVar10->_M_dataplus)._M_p;
              local_f8._16_8_ = psVar10->_M_string_length;
              local_f8._0_8_ = (pointer)0x3a;
              local_f8._8_8_ = "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"";
              local_d8._M_p = (pointer)0x5a;
              local_d0 = 
              "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
              ;
              local_c8._8_8_ = (psVar9->_M_dataplus)._M_p;
              local_c8._M_allocated_capacity = psVar9->_M_string_length;
              local_b8._0_8_ = 2;
              local_b8._8_8_ = "\"\n";
              views._M_len = 5;
              views._M_array = (iterator)local_f8;
              cmCatViews_abi_cxx11_((string *)&local_70,views);
              this_00 = local_78->CMakeInstance;
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_f8);
              cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&local_70,
                                  (cmListFileBacktrace *)local_f8);
              if ((cmMakefile *)local_f8._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_allocated_capacity != &local_60) {
                operator_delete((void *)local_70._M_allocated_capacity,
                                local_60._M_allocated_capacity + 1);
              }
              bVar4 = true;
            }
          }
        }
        local_98._M_right = (_Base_ptr)((long)local_98._M_right + 8);
      } while (local_98._M_right != local_98._M_left);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          cmIsOn(target->GetProperty("ghs_integrity_app"))) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}